

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppCustomRendering(bool *p_open)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  ImU32 IVar4;
  ImU32 IVar5;
  int iVar6;
  ImGuiStyle *pIVar7;
  ImGuiIO_conflict *pIVar8;
  ImVec2 *pIVar9;
  ImDrawList *pIVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float local_394;
  float local_2f8;
  float local_2f4;
  float local_2f0;
  ImVec2 local_2b8;
  ImVec2 window_center;
  ImVec2 window_size;
  ImVec2 window_pos;
  ImVec2 local_298;
  int local_290;
  int n_1;
  ImVec2 local_284;
  float local_27c;
  float y_1;
  ImVec2 local_270;
  float local_268;
  undefined4 local_264;
  float x_1;
  float GRID_STEP;
  ImVec2 local_258;
  ImVec2 local_250;
  ImVec2 drag_delta;
  float mouse_threshold_for_pan;
  ImVec2 mouse_pos_in_canvas;
  ImVec2 origin;
  bool is_active;
  bool is_hovered;
  ImDrawList *draw_list_1;
  ImGuiIO_conflict *io;
  ImVec2 canvas_p1;
  ImVec2 canvas_sz;
  ImVec2 canvas_p0;
  ImVec2 local_200;
  ImVec2 local_1f8;
  ImVec2 local_1f0;
  ImVec2 local_1e8;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  ImVec2 local_1c0;
  ImVec2 local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 cp4 [4];
  ImVec2 cp3 [3];
  ImVec2 local_124;
  ImVec2 local_11c;
  ImVec2 local_114;
  ImVec2 local_10c;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  ImVec2 local_ec;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  float local_9c;
  int local_98;
  float th;
  int n;
  float y;
  float x;
  int curve_segments;
  int circle_segments;
  float rounding;
  ImDrawFlags corners_tl_br;
  float spacing;
  ImU32 local_68;
  float fStack_64;
  ImU32 col;
  ImVec2 p;
  ImU32 col_b_1;
  ImU32 col_a_1;
  ImVec2 p1_1;
  ImVec2 p0_1;
  ImU32 col_b;
  ImU32 col_a;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 gradient_size;
  ImDrawList *draw_list;
  bool *p_open_local;
  
  bVar2 = ImGui::Begin("Example: Custom rendering",p_open,0);
  if (bVar2) {
    bVar2 = ImGui::BeginTabBar("##TabBar",0);
    if (bVar2) {
      bVar2 = ImGui::BeginTabItem("Primitives",(bool *)0x0,0);
      if (bVar2) {
        fVar11 = ImGui::GetFontSize();
        ImGui::PushItemWidth(fVar11 * -15.0);
        pIVar10 = ImGui::GetWindowDrawList();
        ImGui::Text("Gradients");
        fVar11 = ImGui::CalcItemWidth();
        fVar12 = ImGui::GetFrameHeight();
        ImVec2::ImVec2(&p0,fVar11,fVar12);
        p1 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2((ImVec2 *)&col_b,p1.x + p0.x,p1.y + p0.y);
        IVar4 = ImGui::GetColorU32(0xff000000);
        IVar5 = ImGui::GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor(pIVar10,&p1,(ImVec2 *)&col_b,IVar4,IVar5,IVar5,IVar4);
        ImGui::InvisibleButton("##gradient1",&p0,0);
        p1_1 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2((ImVec2 *)&col_b_1,p1_1.x + p0.x,p1_1.y + p0.y);
        IVar4 = ImGui::GetColorU32(0xff00ff00);
        IVar5 = ImGui::GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar10,&p1_1,(ImVec2 *)&col_b_1,IVar4,IVar5,IVar5,IVar4);
        ImGui::InvisibleButton("##gradient2",&p0,0);
        ImGui::Text("All primitives");
        if ((ShowExampleAppCustomRendering(bool*)::colf == '\0') &&
           (iVar6 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::colf), iVar6 != 0)) {
          ImVec4::ImVec4(&ShowExampleAppCustomRendering::colf,1.0,1.0,0.4,1.0);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::colf);
        }
        ImGui::DragFloat("Size",&ShowExampleAppCustomRendering::sz,0.2,2.0,100.0,"%.0f",0);
        ImGui::DragFloat("Thickness",&ShowExampleAppCustomRendering::thickness,0.05,1.0,8.0,"%.02f",
                         0);
        ImGui::SliderInt("N-gon sides",&ShowExampleAppCustomRendering::ngon_sides,3,0xc,"%d",0);
        ImGui::Checkbox("##circlesegmentoverride",
                        &ShowExampleAppCustomRendering::circle_segments_override);
        pIVar7 = ImGui::GetStyle();
        ImGui::SameLine(0.0,(pIVar7->ItemInnerSpacing).x);
        bVar2 = ImGui::SliderInt("Circle segments override",
                                 &ShowExampleAppCustomRendering::circle_segments_override_v,3,0x28,
                                 "%d",0);
        ShowExampleAppCustomRendering::circle_segments_override =
             (bool)(ShowExampleAppCustomRendering::circle_segments_override & 1U | bVar2);
        ImGui::Checkbox("##curvessegmentoverride",
                        &ShowExampleAppCustomRendering::curve_segments_override);
        pIVar7 = ImGui::GetStyle();
        ImGui::SameLine(0.0,(pIVar7->ItemInnerSpacing).x);
        bVar2 = ImGui::SliderInt("Curves segments override",
                                 &ShowExampleAppCustomRendering::curve_segments_override_v,3,0x28,
                                 "%d",0);
        ShowExampleAppCustomRendering::curve_segments_override =
             (bool)(ShowExampleAppCustomRendering::curve_segments_override & 1U | bVar2);
        ImGui::ColorEdit4("Color",&ShowExampleAppCustomRendering::colf.x,0);
        _fStack_64 = ImGui::GetCursorScreenPos();
        ImColor::ImColor((ImColor *)&corners_tl_br,&ShowExampleAppCustomRendering::colf);
        local_68 = ImColor::operator_cast_to_unsigned_int((ImColor *)&corners_tl_br);
        rounding = 10.0;
        circle_segments = 0x90;
        curve_segments = (int)(ShowExampleAppCustomRendering::sz / 5.0);
        if ((ShowExampleAppCustomRendering::circle_segments_override & 1U) == 0) {
          local_2f0 = 0.0;
        }
        else {
          local_2f0 = (float)ShowExampleAppCustomRendering::circle_segments_override_v;
        }
        x = local_2f0;
        if ((ShowExampleAppCustomRendering::curve_segments_override & 1U) == 0) {
          local_2f4 = 0.0;
        }
        else {
          local_2f4 = (float)ShowExampleAppCustomRendering::curve_segments_override_v;
        }
        y = local_2f4;
        th = (float)col + 4.0;
        for (local_98 = 0; n = (int)(fStack_64 + 4.0), local_98 < 2; local_98 = local_98 + 1) {
          if (local_98 == 0) {
            local_2f8 = 1.0;
          }
          else {
            local_2f8 = ShowExampleAppCustomRendering::thickness;
          }
          local_9c = local_2f8;
          ImVec2::ImVec2(&local_a4,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.5 + th);
          ImDrawList::AddNgon(pIVar10,&local_a4,ShowExampleAppCustomRendering::sz * 0.5,local_68,
                              ShowExampleAppCustomRendering::ngon_sides,local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_ac,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.5 + th);
          ImDrawList::AddCircle
                    (pIVar10,&local_ac,ShowExampleAppCustomRendering::sz * 0.5,local_68,(int)x,
                     local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_b4,(float)n,th);
          ImVec2::ImVec2(&local_bc,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar10,&local_b4,&local_bc,local_68,0.0,0,local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_c4,(float)n,th);
          ImVec2::ImVec2(&local_cc,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar10,&local_c4,&local_cc,local_68,(float)curve_segments,0,local_9c)
          ;
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_d4,(float)n,th);
          ImVec2::ImVec2(&local_dc,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar10,&local_d4,&local_dc,local_68,(float)curve_segments,0x90,
                              local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_e4,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,th);
          ImVec2::ImVec2(&local_ec,(float)n + ShowExampleAppCustomRendering::sz,
                         (th + ShowExampleAppCustomRendering::sz) - 0.5);
          ImVec2::ImVec2(&local_f4,(float)n,(th + ShowExampleAppCustomRendering::sz) - 0.5);
          ImDrawList::AddTriangle(pIVar10,&local_e4,&local_ec,&local_f4,local_68,local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_fc,(float)n,th);
          ImVec2::ImVec2(&local_104,(float)n + ShowExampleAppCustomRendering::sz,th);
          ImDrawList::AddLine(pIVar10,&local_fc,&local_104,local_68,local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_10c,(float)n,th);
          ImVec2::ImVec2(&local_114,(float)n,th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(pIVar10,&local_10c,&local_114,local_68,local_9c);
          n = (int)((float)n + 10.0);
          ImVec2::ImVec2(&local_11c,(float)n,th);
          ImVec2::ImVec2(&local_124,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(pIVar10,&local_11c,&local_124,local_68,local_9c);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(cp4 + 3,(float)n,ShowExampleAppCustomRendering::sz * 0.6 + th);
          ImVec2::ImVec2(cp3,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         -ShowExampleAppCustomRendering::sz * 0.4 + th);
          ImVec2::ImVec2(cp3 + 1,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierQuadratic(pIVar10,cp4 + 3,cp3,cp3 + 1,local_68,local_9c,(int)y);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_168,(float)n,th);
          ImVec2::ImVec2(cp4,ShowExampleAppCustomRendering::sz * 1.3 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.3 + th);
          ImVec2::ImVec2(cp4 + 1,-ShowExampleAppCustomRendering::sz * 1.3 +
                                 (float)n + ShowExampleAppCustomRendering::sz,
                         -ShowExampleAppCustomRendering::sz * 0.3 +
                         th + ShowExampleAppCustomRendering::sz);
          ImVec2::ImVec2(cp4 + 2,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierCubic
                    (pIVar10,&local_168,cp4,cp4 + 1,cp4 + 2,local_68,local_9c,(int)y);
          th = ShowExampleAppCustomRendering::sz + 10.0 + th;
        }
        ImVec2::ImVec2(&local_170,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                       ShowExampleAppCustomRendering::sz * 0.5 + th);
        ImDrawList::AddNgonFilled
                  (pIVar10,&local_170,ShowExampleAppCustomRendering::sz * 0.5,local_68,
                   ShowExampleAppCustomRendering::ngon_sides);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_178,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                       ShowExampleAppCustomRendering::sz * 0.5 + th);
        ImDrawList::AddCircleFilled
                  (pIVar10,&local_178,ShowExampleAppCustomRendering::sz * 0.5,local_68,(int)x);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_180,(float)n,th);
        ImVec2::ImVec2(&local_188,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar10,&local_180,&local_188,local_68,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_190,(float)n,th);
        ImVec2::ImVec2(&local_198,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar10,&local_190,&local_198,local_68,10.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1a0,(float)n,th);
        ImVec2::ImVec2(&local_1a8,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar10,&local_1a0,&local_1a8,local_68,10.0,0x90);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1b0,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,th);
        ImVec2::ImVec2(&local_1b8,(float)n + ShowExampleAppCustomRendering::sz,
                       (th + ShowExampleAppCustomRendering::sz) - 0.5);
        ImVec2::ImVec2(&local_1c0,(float)n,(th + ShowExampleAppCustomRendering::sz) - 0.5);
        ImDrawList::AddTriangleFilled(pIVar10,&local_1b0,&local_1b8,&local_1c0,local_68);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1c8,(float)n,th);
        ImVec2::ImVec2(&local_1d0,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::thickness);
        ImDrawList::AddRectFilled(pIVar10,&local_1c8,&local_1d0,local_68,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1d8,(float)n,th);
        ImVec2::ImVec2(&local_1e0,(float)n + ShowExampleAppCustomRendering::thickness,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar10,&local_1d8,&local_1e0,local_68,0.0,0);
        n = (int)((float)n + 20.0);
        ImVec2::ImVec2(&local_1e8,(float)n,th);
        ImVec2::ImVec2(&local_1f0,(float)n + 1.0,th + 1.0);
        ImDrawList::AddRectFilled(pIVar10,&local_1e8,&local_1f0,local_68,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + (float)n);
        ImVec2::ImVec2(&local_1f8,(float)n,th);
        ImVec2::ImVec2(&local_200,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar10,&local_1f8,&local_200,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
        ImVec2::ImVec2(&canvas_p0,(ShowExampleAppCustomRendering::sz + 10.0) * 10.2,
                       (ShowExampleAppCustomRendering::sz + 10.0) * 3.0);
        ImGui::Dummy(&canvas_p0);
        ImGui::PopItemWidth();
        ImGui::EndTabItem();
      }
      bVar2 = ImGui::BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar2) {
        if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
           (iVar6 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar6 != 0))
        {
          ImVector<ImVec2>::ImVector(&ShowExampleAppCustomRendering::points);
          __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering::points,
                       &__dso_handle);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
        }
        if ((ShowExampleAppCustomRendering(bool*)::scrolling == '\0') &&
           (iVar6 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::scrolling),
           iVar6 != 0)) {
          ImVec2::ImVec2(&ShowExampleAppCustomRendering::scrolling,0.0,0.0);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::scrolling);
        }
        ImGui::Checkbox("Enable grid",&ShowExampleAppCustomRendering::opt_enable_grid);
        ImGui::Checkbox("Enable context menu",
                        &ShowExampleAppCustomRendering::opt_enable_context_menu);
        ImGui::Text(
                   "Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu."
                   );
        canvas_sz = ImGui::GetCursorScreenPos();
        canvas_p1 = ImGui::GetContentRegionAvail();
        if (canvas_p1.x < 50.0) {
          canvas_p1.x = 50.0;
        }
        if (canvas_p1.y < 50.0) {
          canvas_p1.y = 50.0;
        }
        ImVec2::ImVec2((ImVec2 *)&io,canvas_sz.x + canvas_p1.x,canvas_sz.y + canvas_p1.y);
        pIVar8 = ImGui::GetIO();
        pIVar10 = ImGui::GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar10,&canvas_sz,(ImVec2 *)&io,0xff323232,0.0,0);
        ImDrawList::AddRect(pIVar10,&canvas_sz,(ImVec2 *)&io,0xffffffff,0.0,0,1.0);
        ImGui::InvisibleButton("canvas",&canvas_p1,3);
        bVar2 = ImGui::IsItemHovered(0);
        bVar3 = ImGui::IsItemActive();
        ImVec2::ImVec2(&mouse_pos_in_canvas,canvas_sz.x + ShowExampleAppCustomRendering::scrolling.x
                       ,canvas_sz.y + ShowExampleAppCustomRendering::scrolling.y);
        ImVec2::ImVec2((ImVec2 *)&drag_delta.y,(pIVar8->MousePos).x - mouse_pos_in_canvas.x,
                       (pIVar8->MousePos).y - mouse_pos_in_canvas.y);
        if (((bVar2) && ((ShowExampleAppCustomRendering::adding_line & 1U) == 0)) &&
           (bVar2 = ImGui::IsMouseClicked(0,false), bVar2)) {
          ImVector<ImVec2>::push_back
                    (&ShowExampleAppCustomRendering::points,(ImVec2 *)&drag_delta.y);
          ImVector<ImVec2>::push_back
                    (&ShowExampleAppCustomRendering::points,(ImVec2 *)&drag_delta.y);
          ShowExampleAppCustomRendering::adding_line = true;
        }
        if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
          pIVar9 = ImVector<ImVec2>::back(&ShowExampleAppCustomRendering::points);
          *pIVar9 = stack0xfffffffffffffdbc;
          bVar2 = ImGui::IsMouseDown(0);
          if (!bVar2) {
            ShowExampleAppCustomRendering::adding_line = false;
          }
        }
        local_394 = -1.0;
        if ((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) == 0) {
          local_394 = 0.0;
        }
        drag_delta.x = local_394;
        if ((bVar3) && (bVar2 = ImGui::IsMouseDragging(1,local_394), bVar2)) {
          ShowExampleAppCustomRendering::scrolling.x =
               (pIVar8->MouseDelta).x + ShowExampleAppCustomRendering::scrolling.x;
          ShowExampleAppCustomRendering::scrolling.y =
               (pIVar8->MouseDelta).y + ShowExampleAppCustomRendering::scrolling.y;
        }
        local_250 = ImGui::GetMouseDragDelta(1,-1.0);
        if ((((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) != 0) &&
            (bVar2 = ImGui::IsMouseReleased(1), bVar2)) && (local_250.x == 0.0)) {
          if ((local_250.y == 0.0) && (!NAN(local_250.y))) {
            ImGui::OpenPopupOnItemClick("context",1);
          }
        }
        bVar2 = ImGui::BeginPopup("context",0);
        if (bVar2) {
          if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
            iVar6 = ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize(&ShowExampleAppCustomRendering::points,iVar6 + -2);
          }
          ShowExampleAppCustomRendering::adding_line = false;
          bVar2 = ImGui::MenuItem("Remove one",(char *)0x0,false,
                                  0 < ShowExampleAppCustomRendering::points.Size);
          if (bVar2) {
            iVar6 = ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize(&ShowExampleAppCustomRendering::points,iVar6 + -2);
          }
          bVar2 = ImGui::MenuItem("Remove all",(char *)0x0,false,
                                  0 < ShowExampleAppCustomRendering::points.Size);
          if (bVar2) {
            ImVector<ImVec2>::clear(&ShowExampleAppCustomRendering::points);
          }
          ImGui::EndPopup();
        }
        local_258 = canvas_sz;
        IVar13.y = io._4_4_;
        IVar13.x = io._0_4_;
        ImDrawList::PushClipRect(pIVar10,canvas_sz,IVar13,true);
        if ((ShowExampleAppCustomRendering::opt_enable_grid & 1U) != 0) {
          local_264 = 0x42800000;
          for (local_268 = fmodf(ShowExampleAppCustomRendering::scrolling.x,64.0);
              local_268 < canvas_p1.x; local_268 = local_268 + 64.0) {
            ImVec2::ImVec2(&local_270,canvas_sz.x + local_268,canvas_sz.y);
            ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd88,canvas_sz.x + local_268,io._4_4_);
            ImDrawList::AddLine(pIVar10,&local_270,(ImVec2 *)&stack0xfffffffffffffd88,0x28c8c8c8,1.0
                               );
          }
          for (local_27c = fmodf(ShowExampleAppCustomRendering::scrolling.y,64.0);
              local_27c < canvas_p1.y; local_27c = local_27c + 64.0) {
            ImVec2::ImVec2(&local_284,canvas_sz.x,canvas_sz.y + local_27c);
            ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd74,io._0_4_,canvas_sz.y + local_27c);
            ImDrawList::AddLine(pIVar10,&local_284,(ImVec2 *)&stack0xfffffffffffffd74,0x28c8c8c8,1.0
                               );
          }
        }
        for (local_290 = 0; fVar11 = mouse_pos_in_canvas.x,
            local_290 < ShowExampleAppCustomRendering::points.Size; local_290 = local_290 + 2) {
          pIVar9 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_290);
          fVar1 = mouse_pos_in_canvas.y;
          fVar12 = pIVar9->x;
          pIVar9 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_290);
          ImVec2::ImVec2(&local_298,fVar11 + fVar12,fVar1 + pIVar9->y);
          fVar12 = mouse_pos_in_canvas.x;
          pIVar9 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_290 + 1);
          fVar1 = mouse_pos_in_canvas.y;
          fVar11 = pIVar9->x;
          pIVar9 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_290 + 1);
          ImVec2::ImVec2(&window_pos,fVar12 + fVar11,fVar1 + pIVar9->y);
          ImDrawList::AddLine(pIVar10,&local_298,&window_pos,0xff00ffff,2.0);
        }
        ImDrawList::PopClipRect(pIVar10);
        ImGui::EndTabItem();
      }
      bVar2 = ImGui::BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar2) {
        ImGui::Checkbox("Draw in Background draw list",&ShowExampleAppCustomRendering::draw_bg);
        ImGui::SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        ImGui::Checkbox("Draw in Foreground draw list",&ShowExampleAppCustomRendering::draw_fg);
        ImGui::SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar13 = ImGui::GetWindowPos();
        window_center = ImGui::GetWindowSize();
        window_size.x = IVar13.x;
        window_size.y = IVar13.y;
        ImVec2::ImVec2(&local_2b8,window_center.x * 0.5 + window_size.x,
                       window_center.y * 0.5 + window_size.y);
        if ((ShowExampleAppCustomRendering::draw_bg & 1U) != 0) {
          pIVar10 = ImGui::GetBackgroundDrawList();
          ImDrawList::AddCircle(pIVar10,&local_2b8,window_center.x * 0.6,0xc80000ff,0,14.0);
        }
        if ((ShowExampleAppCustomRendering::draw_fg & 1U) != 0) {
          pIVar10 = ImGui::GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar10,&local_2b8,window_center.y * 0.6,0xc800ff00,0,10.0);
        }
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppCustomRendering(bool* p_open)
{
    if (!ImGui::Begin("Example: Custom rendering", p_open))
    {
        ImGui::End();
        return;
    }

    // Tip: If you do a lot of custom rendering, you probably want to use your own geometrical types and benefit of
    // overloaded operators, etc. Define IM_VEC2_CLASS_EXTRA in imconfig.h to create implicit conversions between your
    // types and ImVec2/ImVec4. Dear ImGui defines overloaded operators but they are internal to imgui.cpp and not
    // exposed outside (to avoid messing with your types) In this example we are not using the maths operators!

    if (ImGui::BeginTabBar("##TabBar"))
    {
        if (ImGui::BeginTabItem("Primitives"))
        {
            ImGui::PushItemWidth(-ImGui::GetFontSize() * 15);
            ImDrawList* draw_list = ImGui::GetWindowDrawList();

            // Draw gradients
            // (note that those are currently exacerbating our sRGB/Linear issues)
            // Calling ImGui::GetColorU32() multiplies the given colors by the current Style Alpha, but you may pass the IM_COL32() directly as well..
            ImGui::Text("Gradients");
            ImVec2 gradient_size = ImVec2(ImGui::CalcItemWidth(), ImGui::GetFrameHeight());
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 0, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 255, 255, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient1", gradient_size);
            }
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 255, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 0, 0, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient2", gradient_size);
            }

            // Draw a bunch of primitives
            ImGui::Text("All primitives");
            static float sz = 36.0f;
            static float thickness = 3.0f;
            static int ngon_sides = 6;
            static bool circle_segments_override = false;
            static int circle_segments_override_v = 12;
            static bool curve_segments_override = false;
            static int curve_segments_override_v = 8;
            static ImVec4 colf = ImVec4(1.0f, 1.0f, 0.4f, 1.0f);
            ImGui::DragFloat("Size", &sz, 0.2f, 2.0f, 100.0f, "%.0f");
            ImGui::DragFloat("Thickness", &thickness, 0.05f, 1.0f, 8.0f, "%.02f");
            ImGui::SliderInt("N-gon sides", &ngon_sides, 3, 12);
            ImGui::Checkbox("##circlesegmentoverride", &circle_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            circle_segments_override |= ImGui::SliderInt("Circle segments override", &circle_segments_override_v, 3, 40);
            ImGui::Checkbox("##curvessegmentoverride", &curve_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            curve_segments_override |= ImGui::SliderInt("Curves segments override", &curve_segments_override_v, 3, 40);
            ImGui::ColorEdit4("Color", &colf.x);

            const ImVec2 p = ImGui::GetCursorScreenPos();
            const ImU32 col = ImColor(colf);
            const float spacing = 10.0f;
            const ImDrawFlags corners_tl_br = ImDrawFlags_RoundCornersTopLeft | ImDrawFlags_RoundCornersBottomRight;
            const float rounding = sz / 5.0f;
            const int circle_segments = circle_segments_override ? circle_segments_override_v : 0;
            const int curve_segments = curve_segments_override ? curve_segments_override_v : 0;
            float x = p.x + 4.0f;
            float y = p.y + 4.0f;
            for (int n = 0; n < 2; n++)
            {
                // First line uses a thickness of 1.0f, second line uses the configurable thickness
                float th = (n == 0) ? 1.0f : thickness;
                draw_list->AddNgon(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, ngon_sides, th);                 x += sz + spacing;  // N-gon
                draw_list->AddCircle(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments, th);          x += sz + spacing;  // Circle
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 0.0f, ImDrawFlags_None, th);          x += sz + spacing;  // Square
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, ImDrawFlags_None, th);      x += sz + spacing;  // Square with all rounded corners
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, corners_tl_br, th);         x += sz + spacing;  // Square with two rounded corners
                draw_list->AddTriangle(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col, th);x += sz + spacing;  // Triangle
                //draw_list->AddTriangle(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col, th);x+= sz*0.4f + spacing; // Thin triangle
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y), col, th);                                       x += sz + spacing;  // Horizontal line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x, y + sz), col, th);                                       x += spacing;       // Vertical line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y + sz), col, th);                                  x += sz + spacing;  // Diagonal line

                // Quadratic Bezier Curve (3 control points)
                ImVec2 cp3[3] = { ImVec2(x, y + sz * 0.6f), ImVec2(x + sz * 0.5f, y - sz * 0.4f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierQuadratic(cp3[0], cp3[1], cp3[2], col, th, curve_segments); x += sz + spacing;

                // Cubic Bezier Curve (4 control points)
                ImVec2 cp4[4] = { ImVec2(x, y), ImVec2(x + sz * 1.3f, y + sz * 0.3f), ImVec2(x + sz - sz * 1.3f, y + sz - sz * 0.3f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierCubic(cp4[0], cp4[1], cp4[2], cp4[3], col, th, curve_segments);

                x = p.x + 4;
                y += sz + spacing;
            }
            draw_list->AddNgonFilled(ImVec2(x + sz * 0.5f, y + sz * 0.5f), sz*0.5f, col, ngon_sides);               x += sz + spacing;  // N-gon
            draw_list->AddCircleFilled(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments);            x += sz + spacing;  // Circle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col);                                    x += sz + spacing;  // Square
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f);                             x += sz + spacing;  // Square with all rounded corners
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f, corners_tl_br);              x += sz + spacing;  // Square with two rounded corners
            draw_list->AddTriangleFilled(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col);  x += sz + spacing;  // Triangle
            //draw_list->AddTriangleFilled(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col); x += sz*0.4f + spacing; // Thin triangle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + thickness), col);                             x += sz + spacing;  // Horizontal line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + thickness, y + sz), col);                             x += spacing * 2.0f;// Vertical line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + 1, y + 1), col);                                      x += sz;            // Pixel (faster than AddLine)
            draw_list->AddRectFilledMultiColor(ImVec2(x, y), ImVec2(x + sz, y + sz), IM_COL32(0, 0, 0, 255), IM_COL32(255, 0, 0, 255), IM_COL32(255, 255, 0, 255), IM_COL32(0, 255, 0, 255));

            ImGui::Dummy(ImVec2((sz + spacing) * 10.2f, (sz + spacing) * 3.0f));
            ImGui::PopItemWidth();
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Canvas"))
        {
            static ImVector<ImVec2> points;
            static ImVec2 scrolling(0.0f, 0.0f);
            static bool opt_enable_grid = true;
            static bool opt_enable_context_menu = true;
            static bool adding_line = false;

            ImGui::Checkbox("Enable grid", &opt_enable_grid);
            ImGui::Checkbox("Enable context menu", &opt_enable_context_menu);
            ImGui::Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");

            // Typically you would use a BeginChild()/EndChild() pair to benefit from a clipping region + own scrolling.
            // Here we demonstrate that this can be replaced by simple offsetting + custom drawing + PushClipRect/PopClipRect() calls.
            // To use a child window instead we could use, e.g:
            //      ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));      // Disable padding
            //      ImGui::PushStyleColor(ImGuiCol_ChildBg, IM_COL32(50, 50, 50, 255));  // Set a background color
            //      ImGui::BeginChild("canvas", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_NoMove);
            //      ImGui::PopStyleColor();
            //      ImGui::PopStyleVar();
            //      [...]
            //      ImGui::EndChild();

            // Using InvisibleButton() as a convenience 1) it will advance the layout cursor and 2) allows us to use IsItemHovered()/IsItemActive()
            ImVec2 canvas_p0 = ImGui::GetCursorScreenPos();      // ImDrawList API uses screen coordinates!
            ImVec2 canvas_sz = ImGui::GetContentRegionAvail();   // Resize canvas to what's available
            if (canvas_sz.x < 50.0f) canvas_sz.x = 50.0f;
            if (canvas_sz.y < 50.0f) canvas_sz.y = 50.0f;
            ImVec2 canvas_p1 = ImVec2(canvas_p0.x + canvas_sz.x, canvas_p0.y + canvas_sz.y);

            // Draw border and background color
            ImGuiIO& io = ImGui::GetIO();
            ImDrawList* draw_list = ImGui::GetWindowDrawList();
            draw_list->AddRectFilled(canvas_p0, canvas_p1, IM_COL32(50, 50, 50, 255));
            draw_list->AddRect(canvas_p0, canvas_p1, IM_COL32(255, 255, 255, 255));

            // This will catch our interactions
            ImGui::InvisibleButton("canvas", canvas_sz, ImGuiButtonFlags_MouseButtonLeft | ImGuiButtonFlags_MouseButtonRight);
            const bool is_hovered = ImGui::IsItemHovered(); // Hovered
            const bool is_active = ImGui::IsItemActive();   // Held
            const ImVec2 origin(canvas_p0.x + scrolling.x, canvas_p0.y + scrolling.y); // Lock scrolled origin
            const ImVec2 mouse_pos_in_canvas(io.MousePos.x - origin.x, io.MousePos.y - origin.y);

            // Add first and second point
            if (is_hovered && !adding_line && ImGui::IsMouseClicked(ImGuiMouseButton_Left))
            {
                points.push_back(mouse_pos_in_canvas);
                points.push_back(mouse_pos_in_canvas);
                adding_line = true;
            }
            if (adding_line)
            {
                points.back() = mouse_pos_in_canvas;
                if (!ImGui::IsMouseDown(ImGuiMouseButton_Left))
                    adding_line = false;
            }

            // Pan (we use a zero mouse threshold when there's no context menu)
            // You may decide to make that threshold dynamic based on whether the mouse is hovering something etc.
            const float mouse_threshold_for_pan = opt_enable_context_menu ? -1.0f : 0.0f;
            if (is_active && ImGui::IsMouseDragging(ImGuiMouseButton_Right, mouse_threshold_for_pan))
            {
                scrolling.x += io.MouseDelta.x;
                scrolling.y += io.MouseDelta.y;
            }

            // Context menu (under default mouse threshold)
            ImVec2 drag_delta = ImGui::GetMouseDragDelta(ImGuiMouseButton_Right);
            if (opt_enable_context_menu && ImGui::IsMouseReleased(ImGuiMouseButton_Right) && drag_delta.x == 0.0f && drag_delta.y == 0.0f)
                ImGui::OpenPopupOnItemClick("context");
            if (ImGui::BeginPopup("context"))
            {
                if (adding_line)
                    points.resize(points.size() - 2);
                adding_line = false;
                if (ImGui::MenuItem("Remove one", NULL, false, points.Size > 0)) { points.resize(points.size() - 2); }
                if (ImGui::MenuItem("Remove all", NULL, false, points.Size > 0)) { points.clear(); }
                ImGui::EndPopup();
            }

            // Draw grid + all lines in the canvas
            draw_list->PushClipRect(canvas_p0, canvas_p1, true);
            if (opt_enable_grid)
            {
                const float GRID_STEP = 64.0f;
                for (float x = fmodf(scrolling.x, GRID_STEP); x < canvas_sz.x; x += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x + x, canvas_p0.y), ImVec2(canvas_p0.x + x, canvas_p1.y), IM_COL32(200, 200, 200, 40));
                for (float y = fmodf(scrolling.y, GRID_STEP); y < canvas_sz.y; y += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x, canvas_p0.y + y), ImVec2(canvas_p1.x, canvas_p0.y + y), IM_COL32(200, 200, 200, 40));
            }
            for (int n = 0; n < points.Size; n += 2)
                draw_list->AddLine(ImVec2(origin.x + points[n].x, origin.y + points[n].y), ImVec2(origin.x + points[n + 1].x, origin.y + points[n + 1].y), IM_COL32(255, 255, 0, 255), 2.0f);
            draw_list->PopClipRect();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("BG/FG draw lists"))
        {
            static bool draw_bg = true;
            static bool draw_fg = true;
            ImGui::Checkbox("Draw in Background draw list", &draw_bg);
            ImGui::SameLine(); HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
            ImGui::Checkbox("Draw in Foreground draw list", &draw_fg);
            ImGui::SameLine(); HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
            ImVec2 window_pos = ImGui::GetWindowPos();
            ImVec2 window_size = ImGui::GetWindowSize();
            ImVec2 window_center = ImVec2(window_pos.x + window_size.x * 0.5f, window_pos.y + window_size.y * 0.5f);
            if (draw_bg)
                ImGui::GetBackgroundDrawList()->AddCircle(window_center, window_size.x * 0.6f, IM_COL32(255, 0, 0, 200), 0, 10 + 4);
            if (draw_fg)
                ImGui::GetForegroundDrawList()->AddCircle(window_center, window_size.y * 0.6f, IM_COL32(0, 255, 0, 200), 0, 10);
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}